

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# architecture.cc
# Opt level: O0

void __thiscall Architecture::saveXml(Architecture *this,ostream *s)

{
  ostream *s_00;
  uint uVar1;
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *s_local;
  Architecture *this_local;
  
  local_18 = s;
  s_local = (ostream *)this;
  std::operator<<(s,"<save_state");
  s_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"loadersymbols",&local_39);
  a_v_b(s_00,(string *)local_38,(bool)(this->loadersymbols_parsed & 1));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::operator<<(local_18,">\n");
  TypeFactory::saveXml(this->types,local_18);
  Database::saveXml(this->symboltab,local_18);
  (*this->context->_vptr_ContextDatabase[0xf])(this->context,local_18);
  (*this->commentdb->_vptr_CommentDatabase[9])(this->commentdb,local_18);
  uVar1 = (*this->cpool->_vptr_ConstantPool[4])();
  if ((uVar1 & 1) == 0) {
    (*this->cpool->_vptr_ConstantPool[6])(this->cpool,local_18);
  }
  std::operator<<(local_18,"</save_state>\n");
  return;
}

Assistant:

void Architecture::saveXml(ostream &s) const

{
  s << "<save_state";
  a_v_b(s,"loadersymbols",loadersymbols_parsed);
  s << ">\n";
  types->saveXml(s);
  symboltab->saveXml(s);
  context->saveXml(s);
  commentdb->saveXml(s);
  if (!cpool->empty())
    cpool->saveXml(s);
  s << "</save_state>\n";
}